

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O0

void nv21_rgb24_std(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *UV,uint32_t Y_stride,
                   uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,YCbCrType yuv_type)

{
  uint8_t uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  ulong uVar6;
  int16_t y_tmp;
  int16_t g_cbcr_offset;
  int16_t r_cr_offset;
  int16_t b_cb_offset;
  int8_t v_tmp;
  int8_t u_tmp;
  uint8_t *rgb_ptr2;
  uint8_t *rgb_ptr1;
  uint8_t *uv_ptr;
  uint8_t *y_ptr2;
  uint8_t *y_ptr1;
  uint32_t y;
  uint32_t x;
  YUV2RGBParam *param;
  uint32_t UV_stride_local;
  uint32_t Y_stride_local;
  uint8_t *UV_local;
  uint8_t *Y_local;
  uint32_t height_local;
  uint32_t width_local;
  
  uVar6 = (ulong)yuv_type;
  for (y_ptr1._0_4_ = 0; (uint)y_ptr1 < height - 1; y_ptr1._0_4_ = (uint)y_ptr1 + 2) {
    y_ptr2 = Y + (uint)y_ptr1 * Y_stride;
    uv_ptr = Y + ((uint)y_ptr1 + 1) * Y_stride;
    rgb_ptr1 = UV + ((uint)y_ptr1 >> 1) * UV_stride;
    rgb_ptr2 = RGB + (uint)y_ptr1 * RGB_stride;
    _g_cbcr_offset = RGB + ((uint)y_ptr1 + 1) * RGB_stride;
    for (y_ptr1._4_4_ = 0; y_ptr1._4_4_ < width - 1; y_ptr1._4_4_ = y_ptr1._4_4_ + 2) {
      sVar2 = (short)((int)((uint)YUV2RGB[uVar6].cb_factor * (int)(char)(rgb_ptr1[1] + 0x80)) >> 6);
      sVar3 = (short)((int)((uint)YUV2RGB[uVar6].cr_factor * (int)(char)(*rgb_ptr1 + 0x80)) >> 6);
      sVar4 = (short)((int)((uint)YUV2RGB[uVar6].g_cb_factor * (int)(char)(rgb_ptr1[1] + 0x80) +
                           (uint)YUV2RGB[uVar6].g_cr_factor * (int)(char)(*rgb_ptr1 + 0x80)) >> 7);
      sVar5 = (short)((int)((uint)YUV2RGB[uVar6].y_factor *
                           ((uint)*y_ptr2 - (uint)YUV2RGB[uVar6].y_offset)) >> 7);
      uVar1 = clamp(sVar5 + sVar3);
      *rgb_ptr2 = uVar1;
      uVar1 = clamp(sVar5 - sVar4);
      rgb_ptr2[1] = uVar1;
      uVar1 = clamp(sVar5 + sVar2);
      rgb_ptr2[2] = uVar1;
      sVar5 = (short)((int)((uint)YUV2RGB[uVar6].y_factor *
                           ((uint)y_ptr2[1] - (uint)YUV2RGB[uVar6].y_offset)) >> 7);
      uVar1 = clamp(sVar5 + sVar3);
      rgb_ptr2[3] = uVar1;
      uVar1 = clamp(sVar5 - sVar4);
      rgb_ptr2[4] = uVar1;
      uVar1 = clamp(sVar5 + sVar2);
      rgb_ptr2[5] = uVar1;
      sVar5 = (short)((int)((uint)YUV2RGB[uVar6].y_factor *
                           ((uint)*uv_ptr - (uint)YUV2RGB[uVar6].y_offset)) >> 7);
      uVar1 = clamp(sVar5 + sVar3);
      *_g_cbcr_offset = uVar1;
      uVar1 = clamp(sVar5 - sVar4);
      _g_cbcr_offset[1] = uVar1;
      uVar1 = clamp(sVar5 + sVar2);
      _g_cbcr_offset[2] = uVar1;
      sVar5 = (short)((int)((uint)YUV2RGB[uVar6].y_factor *
                           ((uint)uv_ptr[1] - (uint)YUV2RGB[uVar6].y_offset)) >> 7);
      uVar1 = clamp(sVar5 + sVar3);
      _g_cbcr_offset[3] = uVar1;
      uVar1 = clamp(sVar5 - sVar4);
      _g_cbcr_offset[4] = uVar1;
      uVar1 = clamp(sVar5 + sVar2);
      _g_cbcr_offset[5] = uVar1;
      rgb_ptr2 = rgb_ptr2 + 6;
      _g_cbcr_offset = _g_cbcr_offset + 6;
      y_ptr2 = y_ptr2 + 2;
      uv_ptr = uv_ptr + 2;
      rgb_ptr1 = rgb_ptr1 + 2;
    }
  }
  return;
}

Assistant:

void nv21_rgb24_std(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *UV, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*uv_ptr=UV+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			int8_t u_tmp, v_tmp;
			u_tmp = uv_ptr[1]-128;
			v_tmp = uv_ptr[0]-128;
			
			//compute Cb Cr color offsets, common to four pixels
			int16_t b_cb_offset, r_cr_offset, g_cbcr_offset;
			b_cb_offset = (param->cb_factor*u_tmp)>>6;
			r_cr_offset = (param->cr_factor*v_tmp)>>6;
			g_cbcr_offset = (param->g_cb_factor*u_tmp + param->g_cr_factor*v_tmp)>>7;
			
			int16_t y_tmp;
			y_tmp = (param->y_factor*(y_ptr1[0]-param->y_offset))>>7;
			rgb_ptr1[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr1[1]-param->y_offset))>>7;
			rgb_ptr1[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[5] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[0]-param->y_offset))>>7;
			rgb_ptr2[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[1]-param->y_offset))>>7;
			rgb_ptr2[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[5] = clamp(y_tmp + b_cb_offset);
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			uv_ptr += 2;
		}
	}
}